

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,ArrayInit *curr)

{
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  element_type *peVar7;
  size_t sVar8;
  Module *pMVar9;
  long lVar10;
  ulong uVar11;
  size_type sVar12;
  size_type sVar13;
  reference ppEVar14;
  Literal *pLVar15;
  Literal *this_00;
  Name NVar16;
  Name NVar17;
  Flow local_278;
  void *local_230;
  size_t i_1;
  undefined8 uStack_220;
  long local_210;
  ElementSegment *seg_1;
  Field *local_1f0;
  void *addr;
  size_t i;
  uint64_t readSize;
  size_t elemSize;
  undefined8 local_1c8;
  uintptr_t uStack_1c0;
  undefined8 uStack_1b8;
  Field elem;
  DataSegment *seg;
  Module *wasm;
  size_t arraySize;
  size_t sizeVal;
  size_t offsetVal;
  size_t indexVal;
  shared_ptr<wasm::GCData> data;
  Flow size;
  Flow offset;
  Flow index;
  undefined1 local_68 [8];
  Flow ref;
  ArrayInit *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x28));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&offset.breakTo.super_IString.str._M_str,pEVar3,
               *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x30));
    bVar1 = Flow::breaking((Flow *)&offset.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar3,
                 *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x38));
      bVar1 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
      }
      else {
        pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
        ExpressionRunner<wasm::ModuleRunner>::visit
                  ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,pEVar3,
                   *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x40));
        bVar1 = Flow::breaking((Flow *)&data.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__,
                     (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        }
        else {
          Flow::getSingleValue((Flow *)local_68);
          ::wasm::Literal::getGCData();
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&indexVal);
          if (!bVar1) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"null ref");
          }
          Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
          lVar4 = ::wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
          lVar5 = ::wasm::Literal::getUnsigned();
          Flow::getSingleValue
                    ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          pvVar6 = (void *)::wasm::Literal::getUnsigned();
          peVar7 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&indexVal);
          sVar8 = SmallVector<wasm::Literal,_1UL>::size
                            (&(peVar7->values).super_SmallVector<wasm::Literal,_1UL>);
          if (sVar8 < (ulong)(lVar4 + (long)pvVar6)) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds array access in array.init");
          }
          pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
          pMVar9 = ExpressionRunner<wasm::ModuleRunner>::getModule(pEVar3);
          if (*(int *)(ref.breakTo.super_IString.str._M_str + 0x10) == 0) {
            elem._8_8_ = *(undefined8 *)(ref.breakTo.super_IString.str._M_str + 0x18);
            NVar16.super_IString.str._M_str = (char *)elem._8_8_;
            NVar16.super_IString.str._M_len = (size_t)pMVar9;
            lVar10 = ::wasm::Module::getDataSegment(NVar16);
            elemSize = ::wasm::Type::getHeapType();
            ::wasm::HeapType::getArray();
            uStack_1b8 = local_1c8;
            elem.type.id = uStack_1c0;
            uVar2 = ::wasm::Field::getByteSize();
            readSize = (uint64_t)uVar2;
            i = (long)pvVar6 * readSize;
            uVar11 = lVar5 + i;
            sVar13 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)(lVar10 + 0x38));
            if (sVar13 < uVar11) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init_data");
            }
            if (lVar5 + (long)pvVar6 != 0) {
              sVar12 = std::
                       unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       ::count(&this->droppedSegments,
                               (key_type *)(ref.breakTo.super_IString.str._M_str + 0x18));
              if (sVar12 != 0) {
                (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                          (this,"out of bounds segment access in array.init_data");
              }
            }
            for (addr = (void *)0x0; addr < pvVar6; addr = (void *)((long)addr + 1)) {
              local_1f0 = (Field *)std::vector<char,_std::allocator<char>_>::operator[]
                                             ((vector<char,_std::allocator<char>_> *)(lVar10 + 0x38)
                                              ,lVar5 + (long)addr * readSize);
              ::wasm::Literal::makeFromMemory(&seg_1,local_1f0);
              peVar7 = std::
                       __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&indexVal);
              pLVar15 = SmallVector<wasm::Literal,_1UL>::operator[]
                                  (&(peVar7->values).super_SmallVector<wasm::Literal,_1UL>,
                                   lVar4 + (long)addr);
              ::wasm::Literal::operator=(pLVar15,(Literal *)&seg_1);
              ::wasm::Literal::~Literal((Literal *)&seg_1);
            }
            Flow::Flow(__return_storage_ptr__);
          }
          else {
            if (*(int *)(ref.breakTo.super_IString.str._M_str + 0x10) != 1) {
              ::wasm::handle_unreachable
                        ("unexpected op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                         ,0xe71);
            }
            i_1 = *(size_t *)(ref.breakTo.super_IString.str._M_str + 0x18);
            uStack_220 = *(undefined8 *)(ref.breakTo.super_IString.str._M_str + 0x20);
            NVar17.super_IString.str._M_str = (char *)i_1;
            NVar17.super_IString.str._M_len = (size_t)pMVar9;
            local_210 = ::wasm::Module::getElementSegment(NVar17);
            sVar13 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                               ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                (local_210 + 0x38));
            if (sVar13 < (ulong)(lVar5 + (long)pvVar6)) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init");
            }
            for (local_230 = (void *)0x0; local_230 < pvVar6;
                local_230 = (void *)((long)local_230 + 1)) {
              pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
              ppEVar14 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                         operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)(local_210 + 0x38),(size_type)local_230);
              ExpressionRunner<wasm::ModuleRunner>::visit(&local_278,pEVar3,*ppEVar14);
              pLVar15 = Flow::getSingleValue(&local_278);
              peVar7 = std::
                       __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&indexVal);
              this_00 = SmallVector<wasm::Literal,_1UL>::operator[]
                                  (&(peVar7->values).super_SmallVector<wasm::Literal,_1UL>,
                                   lVar4 + (long)local_230);
              ::wasm::Literal::operator=(this_00,pLVar15);
              Flow::~Flow(&local_278);
            }
            Flow::Flow(__return_storage_ptr__);
          }
          std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&indexVal);
        }
        Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      }
      Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)&offset.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayInit(ArrayInit* curr) {
    NOTE_ENTER("ArrayInit");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    size_t offsetVal = offset.getSingleValue().getUnsigned();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    size_t arraySize = data->values.size();
    if ((uint64_t)indexVal + sizeVal > arraySize) {
      trap("out of bounds array access in array.init");
    }

    Module& wasm = *self()->getModule();

    switch (curr->op) {
      case InitData: {
        auto* seg = wasm.getDataSegment(curr->segment);
        auto elem = curr->ref->type.getHeapType().getArray().element;
        size_t elemSize = elem.getByteSize();
        uint64_t readSize = (uint64_t)sizeVal * elemSize;
        if (offsetVal + readSize > seg->data.size()) {
          trap("out of bounds segment access in array.init_data");
        }
        if (offsetVal + sizeVal > 0 && droppedSegments.count(curr->segment)) {
          trap("out of bounds segment access in array.init_data");
        }
        for (size_t i = 0; i < sizeVal; i++) {
          void* addr = (void*)&seg->data[offsetVal + i * elemSize];
          data->values[indexVal + i] = Literal::makeFromMemory(addr, elem);
        }
        return {};
      }
      case InitElem: {
        auto* seg = wasm.getElementSegment(curr->segment);
        if ((uint64_t)offsetVal + sizeVal > seg->data.size()) {
          trap("out of bounds segment access in array.init");
        }
        // TODO: Check whether the segment has been dropped once we support
        // dropping element segments.
        for (size_t i = 0; i < sizeVal; i++) {
          // TODO: This is not correct because it does not preserve the identity
          // of references in the table! ArrayNewSeg suffers the same problem.
          // Fixing it will require changing how we represent segments, at least
          // in the interpreter.
          data->values[indexVal + i] =
            self()->visit(seg->data[i]).getSingleValue();
        }
        return {};
      }
    };
    WASM_UNREACHABLE("unexpected op");
  }